

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

Slice __thiscall leveldb::anon_unknown_3::DBIter::key(DBIter *this)

{
  int iVar1;
  undefined4 extraout_var;
  Slice local_30;
  DBIter *local_20;
  DBIter *this_local;
  
  local_20 = this;
  if ((this->valid_ & 1U) != 0) {
    if (this->direction_ == kForward) {
      iVar1 = (*this->iter_->_vptr_Iterator[8])();
      local_30.data_ = (char *)CONCAT44(extraout_var,iVar1);
      _this_local = ExtractUserKey(&local_30);
    }
    else {
      Slice::Slice((Slice *)&this_local,&this->saved_key_);
    }
    return _this_local;
  }
  __assert_fail("valid_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_iter.cc"
                ,0x41,"virtual Slice leveldb::(anonymous namespace)::DBIter::key() const");
}

Assistant:

Slice key() const override {
    assert(valid_);
    return (direction_ == kForward) ? ExtractUserKey(iter_->key()) : saved_key_;
  }